

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::RayTracingPipelineStateCreateInfoX::RayTracingPipelineStateCreateInfoX
          (RayTracingPipelineStateCreateInfoX *this,RayTracingPipelineStateCreateInfoX *param_1)

{
  RayTracingPipelineStateCreateInfoX *param_1_local;
  RayTracingPipelineStateCreateInfoX *this_local;
  
  PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ::PipelineStateCreateInfoX
            (&this->
              super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
             ,&param_1->
               super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
            );
  std::
  vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  ::vector(&this->GeneralShaders,&param_1->GeneralShaders);
  std::
  vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  ::vector(&this->TriangleHitShaders,&param_1->TriangleHitShaders);
  std::
  vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  ::vector(&this->ProceduralHitShaders,&param_1->ProceduralHitShaders);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  ::vector(&this->ShaderObjects,&param_1->ShaderObjects);
  return;
}

Assistant:

RayTracingPipelineStateCreateInfoX(RayTracingPipelineStateCreateInfoX&&) noexcept = default;